

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

bool __thiscall
OSTEI_VRR_Algorithm_Base::HasVRROfType(OSTEI_VRR_Algorithm_Base *this,RRStepType steptype)

{
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var3 = &(this->vrrmap_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = (this->vrrmap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var3; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    for (p_Var1 = p_Var2[3]._M_parent; p_Var1 != (_Rb_tree_node_base *)&p_Var2[2]._M_right;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      if (p_Var1[1]._M_color == steptype) goto LAB_0010d502;
    }
  }
LAB_0010d502:
  return (_Rb_tree_header *)p_Var2 != p_Var3;
}

Assistant:

bool OSTEI_VRR_Algorithm_Base::HasVRROfType(RRStepType steptype) const
{
    for(const auto & it : vrrmap_)
    {
        for(const auto & it2 : it.second)
        {
            if(it2.type == steptype)
                return true;
        }
    }

    return false;
}